

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

int * vrna_idx_row_wise(uint length)

{
  int *piVar1;
  int *idx;
  int i;
  uint length_local;
  
  piVar1 = (int *)vrna_alloc((length + 1) * 4);
  for (idx._0_4_ = 1; (uint)idx <= length; idx._0_4_ = (uint)idx + 1) {
    piVar1[(int)(uint)idx] = (((length + 1) - (uint)idx) * (length - (uint)idx) >> 1) + length + 1;
  }
  return piVar1;
}

Assistant:

PUBLIC int *
vrna_idx_row_wise(unsigned int length)
{
  int i;
  int *idx = (int *)vrna_alloc(sizeof(int) * (length + 1));

  for (i = 1; i <= length; i++)
    idx[i] = (((length + 1 - i) * (length - i)) / 2) + length + 1;
  return idx;
}